

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3813::SetupInitial(ChElementHexaANCF_3813 *this,ChSystem *system)

{
  ComputeGravityForceScale(this);
  ComputeMassMatrix(this);
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)&this->m_stock_jac_EAS);
  ComputeStiffnessMatrix(this);
  return;
}

Assistant:

void ChElementHexaANCF_3813::SetupInitial(ChSystem* system) {
    // Compute gravitational forces
    ComputeGravityForceScale();
    // Compute mass matrix
    ComputeMassMatrix();
    // initial EAS parameters
    m_stock_jac_EAS.setZero();
    // Compute stiffness matrix
    // (this is not constant in ANCF and will be called automatically many times by ComputeKRMmatricesGlobal()
    // when the solver will run, yet maybe nice to privide an initial nonzero value)
    ComputeStiffnessMatrix();
}